

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::LossLayer::LossLayer(LossLayer *this,LossLayer *from)

{
  void *pvVar1;
  string *initial_value;
  CategoricalCrossEntropyLossLayer *this_00;
  MeanSquaredErrorLossLayer *this_01;
  CategoricalCrossEntropyLossLayer *from_00;
  MeanSquaredErrorLossLayer *from_01;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LossLayer_004122f0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  initial_value = (from->name_).ptr_;
  if ((initial_value != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
      ) && (initial_value->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,initial_value);
  }
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0xb) {
    clear_LossLayerType(this);
    this->_oneof_case_[0] = 0xb;
    this_01 = (MeanSquaredErrorLossLayer *)operator_new(0x28);
    MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer(this_01);
    (this->LossLayerType_).meansquarederrorlosslayer_ = this_01;
    if (from->_oneof_case_[0] == 0xb) {
      from_01 = (from->LossLayerType_).meansquarederrorlosslayer_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_01 = (MeanSquaredErrorLossLayer *)&_MeanSquaredErrorLossLayer_default_instance_;
    }
    MeanSquaredErrorLossLayer::MergeFrom(this_01,from_01);
  }
  else if (from->_oneof_case_[0] == 10) {
    clear_LossLayerType(this);
    this->_oneof_case_[0] = 10;
    this_00 = (CategoricalCrossEntropyLossLayer *)operator_new(0x28);
    CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer(this_00);
    (this->LossLayerType_).categoricalcrossentropylosslayer_ = this_00;
    if (from->_oneof_case_[0] == 10) {
      from_00 = (from->LossLayerType_).categoricalcrossentropylosslayer_;
    }
    else {
      protobuf_NeuralNetwork_2eproto::InitDefaults();
      from_00 = (CategoricalCrossEntropyLossLayer *)
                &_CategoricalCrossEntropyLossLayer_default_instance_;
    }
    CategoricalCrossEntropyLossLayer::MergeFrom(this_00,from_00);
  }
  return;
}

Assistant:

LossLayer::LossLayer(const LossLayer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.name().size() > 0) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  clear_has_LossLayerType();
  switch (from.LossLayerType_case()) {
    case kCategoricalCrossEntropyLossLayer: {
      mutable_categoricalcrossentropylosslayer()->::CoreML::Specification::CategoricalCrossEntropyLossLayer::MergeFrom(from.categoricalcrossentropylosslayer());
      break;
    }
    case kMeanSquaredErrorLossLayer: {
      mutable_meansquarederrorlosslayer()->::CoreML::Specification::MeanSquaredErrorLossLayer::MergeFrom(from.meansquarederrorlosslayer());
      break;
    }
    case LOSSLAYERTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LossLayer)
}